

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

var __thiscall cs::eval(cs *this,context_t *context,string *expr)

{
  size_type sVar1;
  char *ch;
  pointer __x;
  tree_type<cs::token_base_*> tree;
  tree_node *local_80;
  deque<char,_std::allocator<char>_> buff;
  
  tree.mRoot = (tree_node *)0x0;
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  __x = (expr->_M_dataplus)._M_p;
  for (sVar1 = expr->_M_string_length; sVar1 != 0; sVar1 = sVar1 - 1) {
    std::deque<char,_std::allocator<char>_>::push_back(&buff,__x);
    __x = __x + 1;
  }
  compiler_type::build_expr
            ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &buff,&tree,utf8);
  local_80 = tree.mRoot;
  runtime_type::parse_expr
            ((runtime_type *)this,
             (iterator *)
             (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_80,0));
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            (&buff.super__Deque_base<char,_std::allocator<char>_>);
  tree_type<cs::token_base_*>::~tree_type(&tree);
  return (var)(proxy *)this;
}

Assistant:

cs::var eval(const context_t &context, const std::string &expr)
	{
		tree_type<cs::token_base *> tree;
		std::deque<char> buff;
		for (auto &ch: expr)
			buff.push_back(ch);
		context->compiler->build_expr(buff, tree);
		return context->instance->parse_expr(tree.root());
	}